

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

size_t next_pow2(size_t x)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  
  if (x < 2) {
    bVar2 = 0;
  }
  else {
    bVar2 = 0;
    uVar3 = x - 1;
    do {
      bVar2 = bVar2 + 1;
      bVar1 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
  }
  return 1L << (bVar2 & 0x3f);
}

Assistant:

size_t next_pow2(size_t x)
{
  int i = 0;
  x = x > 0 ? x - 1 : 0;
  while (x > 0)
  {
    x >>= 1;
    i++;
  }
  return ((size_t)1) << i;
}